

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketnonblocking.cpp
# Opt level: O0

ssize_t __thiscall
hbm::SocketNonblocking::receiveComplete(SocketNonblocking *this,void *pBlock,size_t size)

{
  int iVar1;
  int *piVar2;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  int in_R8D;
  bool bVar3;
  int nfds;
  pollfd pfd;
  size_t sizeLeft;
  uchar *pPos;
  ssize_t retVal;
  pollfd local_40;
  size_t local_38;
  void *local_30;
  ssize_t local_28;
  size_t local_20;
  
  local_38 = in_RDX;
  local_30 = in_RSI;
  local_20 = in_RDX;
  do {
    while( true ) {
      if (local_38 == 0) {
        return local_20;
      }
      local_28 = BufferedReader::recv
                           ((BufferedReader *)(in_RDI + 0x10),*(int *)(in_RDI + 8),local_30,local_38
                            ,in_R8D);
      if (local_28 < 1) break;
      local_38 = local_38 - local_28;
      local_30 = (void *)(local_28 + (long)local_30);
    }
    if (local_28 == 0) {
      return local_20 - local_38;
    }
    piVar2 = __errno_location();
    if ((*piVar2 != 0xb) && (piVar2 = __errno_location(), *piVar2 != 0xb)) {
      return -1;
    }
    local_40.fd = *(int *)(in_RDI + 8);
    local_40.events = 1;
    do {
      iVar1 = poll(&local_40,1,-1);
      bVar3 = false;
      if (iVar1 == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
  } while (iVar1 == 1);
  return -1;
}

Assistant:

ssize_t hbm::SocketNonblocking::receiveComplete(void* pBlock, size_t size)
{
	ssize_t retVal;
	unsigned char* pPos = reinterpret_cast < unsigned char* > (pBlock);
	size_t sizeLeft = size;
	while(sizeLeft) {
		retVal = m_bufferedReader.recv(m_fd, pPos, sizeLeft);
		if(retVal>0) {
			sizeLeft -= retVal;
			pPos += retVal;
		} else if(retVal==0) {
			return size-sizeLeft;
		} else {
			if(errno==EWOULDBLOCK || errno==EAGAIN) {
				// wait for socket to become readable.
				struct pollfd pfd;
				pfd.fd = m_fd;
				pfd.events = POLLIN;
				int nfds;
				do {
					nfds = poll(&pfd, 1, -1);
				} while((nfds==-1) && (errno==EINTR));
				if(nfds!=1) {
					return -1;
				}
			} else {
				return -1;
			}
		}
	}
	return size;
}